

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O2

void __thiscall ObjectIdentifier::SetValue(ObjectIdentifier *this,char *szOid)

{
  pointer *ppuVar1;
  pointer puVar2;
  size_t sVar3;
  invalid_argument *this_00;
  unsigned_long in;
  ObjectIdentifier *this_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_02;
  uchar local_60 [8];
  uchar buf [8];
  unsigned_long second;
  size_t local_48;
  size_t cbUsed;
  unsigned_long first;
  char *next;
  
  puVar2 = (this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppuVar1 = &(this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if ((this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    *ppuVar1 = puVar2;
  }
  first = 0;
  local_48 = 0;
  this_01 = this;
  GetNextLong(this,szOid,(char **)&first,&cbUsed);
  sVar3 = cbUsed;
  if ((first != 0) && (cbUsed < 3)) {
    this_02 = &this->value;
    GetNextLong(this_01,(char *)first,(char **)&first,(unsigned_long *)buf);
    in = sVar3 * 0x28 + (long)buf;
    pvVar4 = this_02;
    while( true ) {
      EncodeLong(this_01,in,local_60,8,&local_48);
      this_01 = (ObjectIdentifier *)this_02;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_02,
                 (const_iterator)
                 (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start,local_60,local_60 + local_48);
      if (first == 0) break;
      GetNextLong(this_01,(char *)first,(char **)&first,&cbUsed);
      in = cbUsed;
      pvVar4 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1;
    }
    SetOidIndex(this);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Illegal OID");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void ObjectIdentifier::SetValue(const char * szOid)
{
	/*
	Current encoding practice is to multiply the first number by 40, then add the second.
	Practically, anything we care about with respect to crypto starts with 1.

	But let's try to make a general purpose library where we can, so there are the following:
	0, followed by 0-5 as possible values
	1, followed by 0-3
	2, followed by 0-51, with 999 used as an example

	We can then tell which of the three cases we have like so:
	0 - the value is < 40
	1 - value is < 80 and >= 40
	2 - value is >= 80

	*/
	value.clear();

	// This is going to require a substantial parser
	const char* tmp = szOid;
	unsigned long first, second;
	const char* next = nullptr;
	unsigned char buf[8];
	size_t cbUsed = 0;

	// The first two are special
	GetNextLong(tmp, next, first);

	if (next == nullptr || first > 2)
		throw std::invalid_argument("Illegal OID");

	tmp = next;
	GetNextLong(tmp, next, second);

	EncodeLong(first * 40 + second, buf, sizeof(buf), cbUsed);

	value.insert(value.begin(), buf, buf + cbUsed);

	// Now keep going to get the rest of the OID
	while (next != nullptr)
	{
		tmp = next;
		GetNextLong(tmp, next, first);
		EncodeLong(first, buf, sizeof(buf), cbUsed);
		value.insert(value.end(), buf, buf + cbUsed);
	}

    SetOidIndex();
}